

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  XML_Convert_Result XVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  uint uVar10;
  unsigned_short **ppuVar12;
  char **ppcVar13;
  char **ppcVar14;
  uint *puVar15;
  long lVar16;
  char **ppcVar17;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *pcVar18;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  unsigned_short *in_R8;
  char *pcVar19;
  int iVar20;
  char **ppcVar21;
  bool bVar22;
  unsigned_short **ppuStack_70;
  int local_5c;
  char **local_58;
  long local_50;
  char **local_48;
  char *local_40;
  char *local_38;
  uint uVar11;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar18 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    ppcVar14 = (char **)(ptr + 1);
    uVar7 = (long)end - (long)ppcVar14;
    if ((long)uVar7 < 1) {
      return -1;
    }
    ppuStack_70 = (unsigned_short **)0x1;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14)) {
    case 5:
      if (uVar7 == 1) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[0])
                        (enc,(char *)ppcVar14,(char *)&switchD_0016db82::switchdataD_001a0c3c,
                         (char **)0x1);
      if ((iVar4 == 0) &&
         (iVar4 = (*enc[3].scanners[1])(enc,(char *)ppcVar14,extraout_RDX_11,(char **)ppuStack_70),
         iVar4 != 0)) {
        ppuStack_70 = (unsigned_short **)0x2;
        goto switchD_0016db82_caseD_16;
      }
      break;
    case 6:
      if (uVar7 < 3) {
        return -2;
      }
      iVar4 = (*enc[3].literalScanners[1])
                        (enc,(char *)ppcVar14,(char *)&switchD_0016db82::switchdataD_001a0c3c,
                         (char **)0x1);
      if ((iVar4 == 0) &&
         (iVar4 = (*enc[3].scanners[2])(enc,(char *)ppcVar14,extraout_RDX_12,(char **)ppuStack_70),
         iVar4 != 0)) {
        ppuStack_70 = (unsigned_short **)0x3;
        goto switchD_0016db82_caseD_16;
      }
      break;
    case 7:
      if (uVar7 < 4) {
        return -2;
      }
      iVar4 = (*enc[3].nameMatchesAscii)
                        (enc,(char *)ppcVar14,(char *)&switchD_0016db82::switchdataD_001a0c3c,
                         (char *)0x1);
      if ((iVar4 == 0) &&
         (iVar4 = (*enc[3].scanners[3])(enc,(char *)ppcVar14,extraout_RDX_13,(char **)ppuStack_70),
         iVar4 != 0)) {
        ppuStack_70 = (unsigned_short **)0x4;
        goto switchD_0016db82_caseD_16;
      }
      break;
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      pbVar9 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar9);
      if (cVar2 == '\x14') {
        pcVar18 = ptr + 3;
        if ((long)end - (long)pcVar18 < 6) {
          return -1;
        }
        pcVar19 = ptr + 9;
        lVar16 = 0;
        iVar4 = 8;
        do {
          if (lVar16 == 6) {
LAB_0016e24f:
            *nextTokPtr = pcVar19;
            return iVar4;
          }
          if (pcVar18[lVar16] != (&big2_scanCdataSection_CDATA_LSQB)[lVar16]) {
            pcVar19 = pcVar18 + lVar16;
            iVar4 = 0;
            goto LAB_0016e24f;
          }
          lVar16 = lVar16 + 1;
        } while( true );
      }
      if (cVar2 == '\x1b') {
        iVar4 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar4;
      }
      goto LAB_0016e232;
    case 0x11:
      ppcVar14 = (char **)(ptr + 2);
      uVar7 = (long)end - (long)ppcVar14;
      if ((long)uVar7 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
      ppcVar13 = (char **)(ulong)bVar1;
      iVar20 = 0;
      iVar4 = 0;
      ppuStack_70 = (unsigned_short **)0x1;
      if (bVar1 != 0x18) {
        if (bVar1 == 6) {
          if (uVar7 < 3) {
            return -2;
          }
          iVar6 = (*enc[3].literalScanners[1])(enc,(char *)ppcVar14,(char *)0x1,ppcVar13);
          if (iVar6 != 0) goto LAB_0016e907;
          iVar6 = (*enc[3].scanners[2])(enc,(char *)ppcVar14,extraout_RDX_14,ppcVar13);
          ppuStack_70 = (unsigned_short **)0x3;
        }
        else if (bVar1 == 7) {
          if (uVar7 < 4) {
            return -2;
          }
          iVar6 = (*enc[3].nameMatchesAscii)(enc,(char *)ppcVar14,(char *)0x1,(char *)ppcVar13);
          if (iVar6 != 0) goto LAB_0016e907;
          iVar6 = (*enc[3].scanners[3])(enc,(char *)ppcVar14,extraout_RDX_15,ppcVar13);
          ppuStack_70 = (unsigned_short **)0x4;
        }
        else {
          if (bVar1 == 0x16) goto LAB_0016e12d;
          iVar4 = iVar20;
          if (bVar1 != 5) goto LAB_0016e907;
          if (uVar7 == 1) {
            return -2;
          }
          iVar6 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar14,(char *)0x1,ppcVar13);
          if (iVar6 != 0) goto LAB_0016e907;
          iVar6 = (*enc[3].scanners[1])(enc,(char *)ppcVar14,extraout_RDX_10,ppcVar13);
          ppuStack_70 = (unsigned_short **)0x2;
        }
        iVar4 = iVar20;
        if (iVar6 == 0) goto LAB_0016e907;
      }
LAB_0016e12d:
      ppcVar14 = (char **)((long)ppcVar14 + (long)ppuStack_70);
LAB_0016e137:
      ppuStack_70 = (unsigned_short **)0x1;
      uVar7 = (long)end - (long)ppcVar14;
      if ((long)uVar7 < 1) {
        return -1;
      }
      uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
      uVar10 = uVar11 - 5;
      if (0x16 < uVar10) goto switchD_0016e16b_caseD_8;
      pcVar18 = (char *)((long)&switchD_0016e16b::switchdataD_001a0c8c +
                        (long)(int)(&switchD_0016e16b::switchdataD_001a0c8c)[uVar10]);
      switch(uVar11) {
      case 5:
        if (uVar7 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].literalScanners[0])(enc,(char *)ppcVar14,pcVar18,(char **)0x1);
        if (iVar4 != 0) goto switchD_0016e16b_caseD_8;
        XVar5 = (*enc[2].utf16Convert)(enc,ppcVar14,extraout_RDX_16,ppuStack_70,in_R8);
        ppuStack_70 = (unsigned_short **)0x2;
        break;
      case 6:
        if (uVar7 < 3) {
          return -2;
        }
        iVar4 = (*enc[3].literalScanners[1])(enc,(char *)ppcVar14,pcVar18,(char **)0x1);
        if (iVar4 != 0) goto switchD_0016e16b_caseD_8;
        XVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar14);
        ppuStack_70 = (unsigned_short **)0x3;
        break;
      case 7:
        if (uVar7 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)ppcVar14,pcVar18,(char *)0x1);
        if (iVar4 != 0) goto switchD_0016e16b_caseD_8;
        XVar5 = (*enc[3].scanners[0])(enc,(char *)ppcVar14,extraout_RDX_17,(char **)ppuStack_70);
        ppuStack_70 = (unsigned_short **)0x4;
        break;
      default:
        goto switchD_0016e16b_caseD_8;
      case 9:
      case 10:
      case 0x15:
        pcVar18 = end + ~(ulong)ppcVar14;
        while( true ) {
          ppcVar14 = (char **)((long)ppcVar14 + 1);
          if ((long)pcVar18 < 1) {
            return -1;
          }
          bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
          if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
          pcVar18 = pcVar18 + -1;
        }
        if (bVar1 != 0xb) {
switchD_0016e16b_caseD_8:
          iVar4 = 0;
          goto LAB_0016e907;
        }
switchD_0016e16b_caseD_b:
        ppcVar14 = (char **)((long)ppcVar14 + 1);
        iVar4 = 5;
LAB_0016e907:
        *nextTokPtr = (char *)ppcVar14;
        return iVar4;
      case 0xb:
        goto switchD_0016e16b_caseD_b;
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0016e16b_caseD_16;
      }
      if (XVar5 == XML_CONVERT_COMPLETED) goto switchD_0016e16b_caseD_8;
switchD_0016e16b_caseD_16:
      ppcVar14 = (char **)((long)ppcVar14 + (long)ppuStack_70);
      goto LAB_0016e137;
    case 0x16:
    case 0x18:
switchD_0016db82_caseD_16:
      ppcVar14 = (char **)((long)ppcVar14 + (long)ppuStack_70);
      bVar22 = false;
      do {
        uVar7 = (long)end - (long)ppcVar14;
        if ((long)uVar7 < 1) {
          return -1;
        }
        uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
        uVar10 = uVar11 - 5;
        if (0x18 < uVar10) break;
        ppuVar12 = (unsigned_short **)
                   ((long)&switchD_0016dbc6::switchdataD_001a0ce8 +
                   (long)(int)(&switchD_0016dbc6::switchdataD_001a0ce8)[uVar10]);
        switch(uVar11) {
        case 5:
          if (uVar7 == 1) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[0])
                            (enc,(char *)ppcVar14,(char *)&switchD_0016dbc6::switchdataD_001a0ce8,
                             (char **)ppuVar12);
          if (iVar4 != 0) goto switchD_0016db82_caseD_8;
          XVar5 = (*enc[2].utf16Convert)(enc,ppcVar14,extraout_RDX_03,ppuVar12,in_R8);
          ppuStack_70 = (unsigned_short **)0x2;
          break;
        case 6:
          if (uVar7 < 3) {
            return -2;
          }
          iVar4 = (*enc[3].literalScanners[1])
                            (enc,(char *)ppcVar14,(char *)&switchD_0016dbc6::switchdataD_001a0ce8,
                             (char **)ppuVar12);
          if (iVar4 != 0) goto switchD_0016db82_caseD_8;
          XVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar14);
          ppuStack_70 = (unsigned_short **)0x3;
          break;
        case 7:
          if (uVar7 < 4) {
            return -2;
          }
          iVar4 = (*enc[3].nameMatchesAscii)
                            (enc,(char *)ppcVar14,(char *)&switchD_0016dbc6::switchdataD_001a0ce8,
                             (char *)ppuVar12);
          if (iVar4 != 0) goto switchD_0016db82_caseD_8;
          XVar5 = (*enc[3].scanners[0])(enc,(char *)ppcVar14,extraout_RDX_02,(char **)ppuVar12);
          ppuStack_70 = (unsigned_short **)0x4;
          break;
        default:
          goto switchD_0016db82_caseD_8;
        case 9:
        case 10:
        case 0x15:
          pcVar18 = end + ~(ulong)ppcVar14;
          puVar15 = &switchD_0016e07a::switchdataD_001a0d4c;
          goto LAB_0016e050;
        case 0xb:
          goto switchD_0016dbc6_caseD_b;
        case 0x11:
          goto switchD_0016dbc6_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          ppuStack_70 = (unsigned_short **)0x1;
          goto LAB_0016dcd3;
        case 0x17:
          if (!bVar22) {
            ptr = (char *)((long)ppcVar14 + 1);
            ppcVar13 = (char **)(end + -(long)ptr);
            if ((long)ppcVar13 < 1) {
              return -1;
            }
            cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            if (cVar2 == '\x05') {
              if (ppcVar13 == (char **)0x1) {
                return -2;
              }
              iVar4 = (*enc[3].literalScanners[0])
                                (enc,ptr,(char *)&switchD_0016dbc6::switchdataD_001a0ce8,ppcVar13);
              if (iVar4 != 0) goto switchD_0016da00_caseD_0;
              iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_06,ppcVar13);
              ppuStack_70 = (unsigned_short **)0x3;
            }
            else if (cVar2 == '\x06') {
              if (ppcVar13 < (char **)0x3) {
                return -2;
              }
              iVar4 = (*enc[3].literalScanners[1])
                                (enc,ptr,(char *)&switchD_0016dbc6::switchdataD_001a0ce8,ppcVar13);
              if (iVar4 != 0) goto switchD_0016da00_caseD_0;
              iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_05,ppcVar13);
              ppuStack_70 = (unsigned_short **)0x4;
            }
            else {
              if (cVar2 != '\a') {
                ppuStack_70 = (unsigned_short **)0x2;
                bVar22 = true;
                if ((cVar2 == '\x16') || (bVar22 = true, cVar2 == '\x18')) goto LAB_0016dcd3;
                goto switchD_0016da00_caseD_0;
              }
              if (ppcVar13 < (char **)0x4) {
                return -2;
              }
              iVar4 = (*enc[3].nameMatchesAscii)
                                (enc,ptr,(char *)&switchD_0016dbc6::switchdataD_001a0ce8,
                                 (char *)ppcVar13);
              if (iVar4 != 0) goto switchD_0016da00_caseD_0;
              iVar4 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_04,ppcVar13);
              ppuStack_70 = (unsigned_short **)0x5;
            }
            bVar22 = true;
            if (iVar4 != 0) goto LAB_0016dcd3;
            goto switchD_0016da00_caseD_0;
          }
          goto switchD_0016db82_caseD_8;
        }
        if (XVar5 == XML_CONVERT_COMPLETED) break;
LAB_0016dcd3:
        ppcVar14 = (char **)((long)ppcVar14 + (long)ppuStack_70);
      } while( true );
    }
switchD_0016db82_caseD_8:
    *nextTokPtr = (char *)ppcVar14;
    return 0;
  case 3:
    iVar4 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 4:
    pbVar9 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
      return -5;
    }
    if (*pbVar9 == 0x5d) {
      ptr = ptr + 2;
      if (end == ptr || (long)end - (long)ptr < 0) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto LAB_0016dd8b;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,ptr,end,(char **)&switchD_0016da00::switchdataD_001a0c10);
    if (iVar4 == 0) {
      pbVar9 = (byte *)(ptr + 2);
      pcVar18 = extraout_RDX_00;
      goto LAB_0016dd8b;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,ptr,end,(char **)&switchD_0016da00::switchdataD_001a0c10);
    if (iVar4 == 0) {
      pbVar9 = (byte *)(ptr + 3);
      pcVar18 = extraout_RDX;
      goto LAB_0016dd8b;
    }
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,end,(char *)&switchD_0016da00::switchdataD_001a0c10);
    if (iVar4 == 0) {
      pbVar9 = (byte *)(ptr + 4);
      pcVar18 = extraout_RDX_01;
      goto LAB_0016dd8b;
    }
    break;
  case 9:
    pcVar18 = ptr + 1;
    if (end != pcVar18 && -1 < (long)end - (long)pcVar18) {
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar18 = ptr + 2;
      }
      *nextTokPtr = pcVar18;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar9 = (byte *)(ptr + 1);
LAB_0016dd8b:
    pbVar8 = pbVar9;
    ppcVar14 = (char **)(end + -(long)pbVar8);
    if ((long)ppcVar14 < 1) goto switchD_0016ddbd_caseD_0;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar8)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      break;
    case 4:
      if (ppcVar14 == (char **)0x1) break;
      pbVar9 = pbVar8 + 1;
      if (pbVar8[1] != 0x5d) goto LAB_0016dd8b;
      if (ppcVar14 < (char **)0x3) break;
      if (pbVar8[2] == 0x3e) goto LAB_0016dffe;
      goto LAB_0016dd8b;
    case 5:
      if ((ppcVar14 != (char **)0x1) &&
         (iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar8,pcVar18,ppcVar14), iVar4 == 0)) {
        pbVar9 = pbVar8 + 2;
        pcVar18 = extraout_RDX_08;
        goto LAB_0016dd8b;
      }
      break;
    case 6:
      if (((char **)0x2 < ppcVar14) &&
         (iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar8,pcVar18,ppcVar14), iVar4 == 0)) {
        pbVar9 = pbVar8 + 3;
        pcVar18 = extraout_RDX_07;
        goto LAB_0016dd8b;
      }
      break;
    case 7:
      if (((char **)0x3 < ppcVar14) &&
         (iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar8,pcVar18,(char *)ppcVar14),
         iVar4 == 0)) {
        pbVar9 = pbVar8 + 4;
        pcVar18 = extraout_RDX_09;
        goto LAB_0016dd8b;
      }
      break;
    default:
      pbVar9 = pbVar8 + 1;
      goto LAB_0016dd8b;
    }
switchD_0016ddbd_caseD_0:
    *nextTokPtr = (char *)pbVar8;
    return 6;
  }
switchD_0016da00_caseD_0:
  *nextTokPtr = ptr;
  return 0;
LAB_0016dffe:
  ptr = (char *)(pbVar8 + 2);
  goto switchD_0016da00_caseD_0;
LAB_0016e050:
  ppcVar14 = (char **)((long)ppcVar14 + 1);
  if ((long)pcVar18 < 1) {
    return -1;
  }
  uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
  uVar10 = uVar11 - 5;
  if (0x18 < uVar10) goto switchD_0016db82_caseD_8;
  pcVar19 = (char *)((long)&switchD_0016e07a::switchdataD_001a0d4c +
                    (long)(int)(&switchD_0016e07a::switchdataD_001a0d4c)[uVar10]);
  switch(uVar11) {
  case 5:
    if (pcVar18 == (char *)0x1) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,(char *)ppcVar14,pcVar19,(char **)&switchD_0016e07a::switchdataD_001a0d4c
                      );
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].scanners[1])(enc,(char *)ppcVar14,extraout_RDX_27,(char **)puVar15),
       iVar4 == 0)) goto switchD_0016db82_caseD_8;
    ppuStack_70 = (unsigned_short **)0x3;
    break;
  case 6:
    if (pcVar18 < (char *)0x3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,(char *)ppcVar14,pcVar19,(char **)&switchD_0016e07a::switchdataD_001a0d4c
                      );
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].scanners[2])(enc,(char *)ppcVar14,extraout_RDX_26,(char **)puVar15),
       iVar4 == 0)) goto switchD_0016db82_caseD_8;
    ppuStack_70 = (unsigned_short **)0x4;
    break;
  case 7:
    if (pcVar18 < (char *)0x4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)
                      (enc,(char *)ppcVar14,pcVar19,(char *)&switchD_0016e07a::switchdataD_001a0d4c)
    ;
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].scanners[3])(enc,(char *)ppcVar14,extraout_RDX_28,(char **)puVar15),
       iVar4 == 0)) goto switchD_0016db82_caseD_8;
    ppuStack_70 = (unsigned_short **)0x5;
    break;
  default:
    goto switchD_0016db82_caseD_8;
  case 9:
  case 10:
  case 0x15:
    goto switchD_0016e07a_caseD_9;
  case 0xb:
    goto switchD_0016dbc6_caseD_b;
  case 0x11:
    goto switchD_0016dbc6_caseD_11;
  case 0x16:
  case 0x18:
    ppuStack_70 = (unsigned_short **)0x2;
  }
  local_58 = (char **)((long)ppcVar14 + (long)ppuStack_70 + -1);
  local_40 = end + -1;
  local_38 = end + -2;
  bVar22 = false;
  goto LAB_0016e288;
switchD_0016e07a_caseD_9:
  pcVar18 = pcVar18 + -1;
  goto LAB_0016e050;
LAB_0016e288:
  ppcVar14 = local_58;
  uVar7 = (long)end - (long)local_58;
  if ((long)uVar7 < 1) {
    return -1;
  }
  uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_58);
  uVar10 = uVar11 - 5;
  if (0x16 < uVar10) {
switchD_0016e2b8_caseD_8:
    local_5c = 0;
    goto switchD_0016e4eb_caseD_0;
  }
  ppuVar12 = (unsigned_short **)
             ((long)&switchD_0016e2b8::switchdataD_001a0db0 +
             (long)(int)(&switchD_0016e2b8::switchdataD_001a0db0)[uVar10]);
  switch(uVar11) {
  case 5:
    local_5c = 0;
    if (uVar7 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,(char *)local_58,(char *)&switchD_0016e2b8::switchdataD_001a0db0,
                       (char **)ppuVar12);
    if ((iVar4 == 0) &&
       (XVar5 = (*enc[2].utf16Convert)(enc,ppcVar14,extraout_RDX_19,ppuVar12,in_R8),
       XVar5 != XML_CONVERT_COMPLETED)) {
      local_58 = (char **)((long)ppcVar14 + 2);
      goto LAB_0016e288;
    }
    break;
  case 6:
    local_5c = 0;
    if (uVar7 < 3) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[1])
                      (enc,(char *)local_58,(char *)&switchD_0016e2b8::switchdataD_001a0db0,
                       (char **)ppuVar12);
    if ((iVar4 == 0) && (iVar4 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar14), iVar4 != 0)) {
      local_58 = (char **)((long)ppcVar14 + 3);
      goto LAB_0016e288;
    }
    break;
  case 7:
    local_5c = 0;
    if (uVar7 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].nameMatchesAscii)
                      (enc,(char *)local_58,(char *)&switchD_0016e2b8::switchdataD_001a0db0,
                       (char *)ppuVar12);
    if ((iVar4 == 0) &&
       (iVar4 = (*enc[3].scanners[0])(enc,(char *)ppcVar14,extraout_RDX_18,(char **)ppuVar12),
       iVar4 != 0)) {
      local_58 = (char **)((long)ppcVar14 + 4);
      goto LAB_0016e288;
    }
    break;
  default:
    goto switchD_0016e2b8_caseD_8;
  case 9:
  case 10:
  case 0x15:
    local_5c = 0;
    lVar16 = (long)local_40 - (long)local_58;
    while( true ) {
      ppcVar14 = (char **)((long)ppcVar14 + 1);
      if (lVar16 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
      if ((1 < bVar1 - 9) && (bVar1 != 0x15)) break;
      lVar16 = lVar16 + -1;
    }
    if (bVar1 == 0xe) goto LAB_0016e45a;
    break;
  case 0xe:
LAB_0016e45a:
    local_5c = 0;
    lVar16 = (long)local_40 - (long)ppcVar14;
    do {
      ppcVar14 = (char **)((long)ppcVar14 + 1);
      if (lVar16 < 1) {
        return -1;
      }
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar14);
      local_58 = ppcVar14;
      if ((bVar1 & 0xfe) == 0xc) {
switchD_0016e4eb_caseD_4:
        do {
          local_58 = (char **)((long)local_58 + 1);
          while( true ) {
            ppcVar14 = local_58;
            uVar7 = (long)end - (long)local_58;
            if ((long)uVar7 < 1) {
              return -1;
            }
            bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_58);
            if (bVar3 == bVar1) {
              ppcVar13 = (char **)((long)local_58 + 1);
              if ((char **)end == ppcVar13 || (long)end - (long)ppcVar13 < 0) {
                return -1;
              }
              bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
              if ((bVar1 - 9 < 2) || (bVar1 == 0x15)) {
                ppcVar17 = (char **)(local_38 + -(long)local_58);
                local_50 = 0;
                ppcVar21 = ppcVar13;
                goto LAB_0016e690;
              }
              if (bVar1 == 0xb) goto LAB_0016e985;
              if (bVar1 == 0x11) goto LAB_0016e947;
              goto LAB_0016e993;
            }
            uVar10 = (uint)bVar3;
            if (8 < uVar10) break;
            ppcVar13 = (char **)((long)&switchD_0016e4eb::switchdataD_001a0e0c +
                                (long)(int)(&switchD_0016e4eb::switchdataD_001a0e0c)[uVar10]);
            switch(uVar10) {
            default:
              goto switchD_0016e4eb_caseD_0;
            case 3:
              iVar4 = normal_scanRef(enc,(char *)((long)local_58 + 1),end,(char **)&local_58);
              if (iVar4 < 1) {
                ppcVar13 = local_58;
                if (iVar4 != 0) {
                  return iVar4;
                }
                goto LAB_0016e993;
              }
              break;
            case 4:
              goto switchD_0016e4eb_caseD_4;
            case 5:
              if (uVar7 == 1) {
                return -2;
              }
              iVar4 = (*enc[3].literalScanners[0])
                                (enc,(char *)local_58,
                                 (char *)&switchD_0016e4eb::switchdataD_001a0e0c,ppcVar13);
              if (iVar4 != 0) goto switchD_0016e4eb_caseD_0;
              local_58 = (char **)((long)ppcVar14 + 2);
              break;
            case 6:
              if (uVar7 < 3) {
                return -2;
              }
              iVar4 = (*enc[3].literalScanners[1])
                                (enc,(char *)local_58,
                                 (char *)&switchD_0016e4eb::switchdataD_001a0e0c,ppcVar13);
              if (iVar4 != 0) goto switchD_0016e4eb_caseD_0;
              local_58 = (char **)((long)ppcVar14 + 3);
              break;
            case 7:
              if (uVar7 < 4) {
                return -2;
              }
              iVar4 = (*enc[3].nameMatchesAscii)
                                (enc,(char *)local_58,
                                 (char *)&switchD_0016e4eb::switchdataD_001a0e0c,(char *)ppcVar13);
              if (iVar4 != 0) goto switchD_0016e4eb_caseD_0;
              local_58 = (char **)((long)ppcVar14 + 4);
            }
          }
        } while( true );
      }
      if ((0x15 < bVar1) || ((0x200600U >> (bVar1 & 0x1f) & 1) == 0)) break;
      lVar16 = lVar16 + -1;
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_58 = (char **)((long)local_58 + 1);
    goto LAB_0016e288;
  case 0x17:
    local_5c = 0;
    if (bVar22) break;
    ppcVar13 = (char **)((long)local_58 + 1);
    uVar7 = (long)end - (long)ppcVar13;
    if ((long)uVar7 < 1) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
    ppcVar21 = (char **)(ulong)bVar1;
    if (bVar1 == 5) {
      if (uVar7 == 1) {
        return -2;
      }
      local_58 = ppcVar13;
      iVar4 = (*enc[3].literalScanners[0])
                        (enc,(char *)ppcVar13,(char *)&switchD_0016e2b8::switchdataD_001a0db0,
                         ppcVar21);
      if ((iVar4 != 0) ||
         (iVar4 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,extraout_RDX_22,ppcVar21), iVar4 == 0))
      goto LAB_0016e993;
      local_58 = (char **)((long)ppcVar14 + 3);
    }
    else if (bVar1 == 6) {
      if (uVar7 < 3) {
        return -2;
      }
      local_58 = ppcVar13;
      iVar4 = (*enc[3].literalScanners[1])
                        (enc,(char *)ppcVar13,(char *)&switchD_0016e2b8::switchdataD_001a0db0,
                         ppcVar21);
      if ((iVar4 != 0) ||
         (iVar4 = (*enc[3].scanners[2])(enc,(char *)ppcVar13,extraout_RDX_20,ppcVar21), iVar4 == 0))
      goto LAB_0016e993;
      local_58 = (char **)((long)ppcVar14 + 4);
    }
    else if (bVar1 == 7) {
      if (uVar7 < 4) {
        return -2;
      }
      local_58 = ppcVar13;
      iVar4 = (*enc[3].nameMatchesAscii)
                        (enc,(char *)ppcVar13,(char *)&switchD_0016e2b8::switchdataD_001a0db0,
                         (char *)ppcVar21);
      if ((iVar4 != 0) ||
         (iVar4 = (*enc[3].scanners[3])(enc,(char *)ppcVar13,extraout_RDX_21,ppcVar21), iVar4 == 0))
      goto LAB_0016e993;
      local_58 = (char **)((long)ppcVar14 + 5);
    }
    else {
      if ((bVar1 != 0x18) && (bVar1 != 0x16)) goto LAB_0016e993;
      local_58 = (char **)((long)local_58 + 2);
    }
    bVar22 = true;
    goto LAB_0016e288;
  }
switchD_0016e4eb_caseD_0:
  ppcVar13 = ppcVar14;
  goto LAB_0016e993;
LAB_0016e690:
  if ((long)ppcVar17 < 1) {
    return -1;
  }
  uVar11 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)((long)local_58 + local_50 + 2));
  uVar10 = uVar11 - 5;
  if (0x13 < uVar10) {
switchD_0016e6ca_caseD_8:
    ppcVar13 = (char **)((long)local_58 + local_50 + 2);
    goto LAB_0016e993;
  }
  ppcVar21 = (char **)((long)ppcVar21 + 1);
  pcVar18 = (char *)((long)&switchD_0016e6ca::switchdataD_001a0e30 +
                    (long)(int)(&switchD_0016e6ca::switchdataD_001a0e30)[uVar10]);
  switch(uVar11) {
  case 5:
    goto switchD_0016e6ca_caseD_5;
  case 6:
    if (ppcVar17 < (char **)0x3) {
      return -2;
    }
    local_48 = (char **)((long)local_58 + local_50 + 2);
    local_58 = ppcVar13;
    iVar4 = (*enc[3].literalScanners[1])(enc,(char *)local_48,pcVar18,ppcVar17);
    ppcVar13 = ppcVar21;
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].scanners[2])(enc,(char *)local_48,extraout_RDX_23,ppcVar17), iVar4 == 0))
    goto LAB_0016e993;
    local_58 = (char **)((long)ppcVar14 + local_50 + 5);
    goto LAB_0016e7e6;
  case 7:
    if (ppcVar17 < (char **)0x4) {
      return -2;
    }
    local_48 = (char **)((long)local_58 + local_50 + 2);
    local_58 = ppcVar13;
    iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)local_48,pcVar18,(char *)ppcVar17);
    ppcVar13 = local_48;
    if ((iVar4 != 0) ||
       (iVar4 = (*enc[3].scanners[3])(enc,(char *)local_48,extraout_RDX_25,ppcVar17),
       ppcVar13 = ppcVar21, iVar4 == 0)) goto LAB_0016e993;
    local_58 = (char **)((long)ppcVar14 + local_50 + 6);
    goto LAB_0016e7e6;
  default:
    goto switchD_0016e6ca_caseD_8;
  case 9:
  case 10:
  case 0x15:
    break;
  case 0xb:
    local_58 = (char **)((long)local_58 + local_50 + 1);
LAB_0016e985:
    ppcVar14 = (char **)((long)local_58 + 2);
    local_5c = 1;
    goto switchD_0016e4eb_caseD_0;
  case 0x11:
    ppcVar13 = (char **)((long)local_58 + local_50 + 2);
LAB_0016e947:
    ppcVar14 = (char **)((long)ppcVar13 + 1);
    if ((char **)end == ppcVar14 || (long)end - (long)ppcVar14 < 0) {
      return -1;
    }
    bVar22 = *(byte *)((long)ppcVar13 + 1) == 0x3e;
    if (bVar22) {
      ppcVar14 = (char **)((long)ppcVar13 + 2);
    }
    local_5c = (uint)bVar22 * 3;
    ppcVar13 = ppcVar14;
    goto LAB_0016e993;
  case 0x16:
  case 0x18:
    local_58 = (char **)((long)local_58 + local_50 + 3);
    goto LAB_0016e7e6;
  }
  local_50 = local_50 + 1;
  ppcVar17 = (char **)((long)ppcVar17 + -1);
  goto LAB_0016e690;
switchD_0016e6ca_caseD_5:
  if (uVar7 - 3 == local_50) {
    return -2;
  }
  local_48 = (char **)((long)local_58 + local_50 + 2);
  local_58 = ppcVar13;
  iVar4 = (*enc[3].literalScanners[0])(enc,(char *)local_48,pcVar18,ppcVar17);
  ppcVar13 = ppcVar21;
  if ((iVar4 != 0) ||
     (iVar4 = (*enc[3].scanners[1])(enc,(char *)local_48,extraout_RDX_24,ppcVar17), iVar4 == 0)) {
LAB_0016e993:
    *nextTokPtr = (char *)ppcVar13;
    return local_5c;
  }
  local_58 = (char **)((long)ppcVar14 + local_50 + 4);
LAB_0016e7e6:
  bVar22 = false;
  goto LAB_0016e288;
switchD_0016dbc6_caseD_b:
  *nextTokPtr = (char *)((long)ppcVar14 + 1);
  return 2;
switchD_0016dbc6_caseD_11:
  pbVar9 = (byte *)((long)ppcVar14 + 1);
  if ((byte *)end == pbVar9 || (long)end - (long)pbVar9 < 0) {
    return -1;
  }
  if (*pbVar9 == 0x3e) {
    *nextTokPtr = (char *)((long)ppcVar14 + 2);
    return 4;
  }
LAB_0016e232:
  *nextTokPtr = (char *)pbVar9;
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}